

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

long data_cb(cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,long nframes
            )

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (0 < nframes) {
    fVar1 = *user_ptr;
    iVar2 = *(int *)((long)user_ptr + 4);
    lVar3 = *(long *)((long)user_ptr + 8);
    lVar4 = 0;
    do {
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      dVar5 = sin(((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                  (((double)fVar1 * 6.283185307179586) / (double)iVar2));
      lVar3 = *(long *)((long)user_ptr + 8) + 1;
      *(long *)((long)user_ptr + 8) = lVar3;
      *(float *)((long)output_buffer + lVar4 * 4) = (float)dVar5 * 0.8;
      lVar4 = lVar4 + 1;
    } while (nframes != lVar4);
  }
  return nframes;
}

Assistant:

long
data_cb(cubeb_stream * stream, void * user_ptr, void const * input_buffer,
        void * output_buffer, long nframes)
{
  sine_wave_state * state = static_cast<sine_wave_state *>(user_ptr);
  float * out = static_cast<float *>(output_buffer);
  double phase_increment = 2.0f * M_PI * state->frequency / state->sample_rate;

  for (int i = 0; i < nframes; i++) {
    float sample = sin(phase_increment * state->count);
    state->count++;
    out[i] = sample * 0.8;
  }
  return nframes;
}